

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O0

Pass * wasm::createDataFlowOptsPass(void)

{
  DataFlowOpts *this;
  
  this = (DataFlowOpts *)operator_new(0x390);
  memset(this,0,0x390);
  DataFlowOpts::DataFlowOpts(this);
  return (Pass *)this;
}

Assistant:

Pass* createDataFlowOptsPass() { return new DataFlowOpts(); }